

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

bool __thiscall
gnuplotio::
PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_std::vector<double,_std::allocator<double>_>_>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_*,_std::vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
::is_end(PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_std::vector<double,_std::allocator<double>_>_>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_*,_std::vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
         *this)

{
  bool bVar1;
  bool bVar2;
  length_error *this_00;
  bool er;
  bool el;
  PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_std::vector<double,_std::allocator<double>_>_>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_*,_std::vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  *this_local;
  
  bVar1 = IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
          ::is_end(&this->l);
  bVar2 = IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_*,_std::vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
          ::is_end(&this->r);
  if (bVar1 != bVar2) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this_00,"columns were different lengths");
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  return bVar1;
}

Assistant:

bool is_end() const {
        bool el = l.is_end();
        bool er = r.is_end();
        if(el != er) {
            throw std::length_error("columns were different lengths");
        }
        return el;
    }